

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

bool_t gf2Tr(word *a,qr_o *f,void *stack)

{
  size_t sVar1;
  bool_t bVar2;
  word *in_RDX;
  qr_o *in_RSI;
  word *in_RDI;
  word *t;
  size_t m;
  size_t local_28;
  uint local_4;
  
  local_28 = gf2Deg(in_RSI);
  sVar1 = in_RSI->n;
  wwCopy(in_RDX,in_RDI,in_RSI->n);
  while (local_28 = local_28 - 1, local_28 != 0) {
    (*in_RSI->sqr)(in_RDX,in_RDX,in_RSI,in_RDX + sVar1);
    wwXor2(in_RDX,in_RDI,in_RSI->n);
  }
  bVar2 = wwIsZero(in_RDX,in_RSI->n);
  local_4 = (uint)(bVar2 == 0);
  return local_4;
}

Assistant:

bool_t gf2Tr(const word a[], const qr_o* f, void* stack)
{
	size_t m = gf2Deg(f);
	word* t = (word*)stack;
	stack = t + f->n;
	// pre
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	// t <- sum_{i = 0}^{m - 1} a^{2^i}
	qrCopy(t, a, f);
	while (--m)
	{
		qrSqr(t, t, f, stack);
		gf2Add2(t, a, f);
	}
	// t == 0?
	if (qrIsZero(t, f))
		return FALSE;
	// t == 1?
	ASSERT(qrIsUnity(t, f));
	return TRUE;
}